

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O1

void phmap::priv::
     BucketCountAllocTest<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>,4ul,std::mutex>>
               (void)

{
  size_t sz;
  long lVar1;
  long lVar2;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  A alloc;
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
  m;
  AssertHelper local_758;
  Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_748;
  undefined1 local_740 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_738;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_730;
  AssertHelper local_720;
  allocator_type local_718;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_710;
  
  local_718.id_ = 0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::parallel_hash_set(&local_710,0x7b,&local_718);
  local_750.id_ =
       (size_t)local_710.sets_._M_elems[0].set_.settings_.
               super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
               .
               super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
               .
               super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
               .
               super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
               .
               super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_false>
               ._M_head_impl.id_;
  testing::internal::
  CmpHelperEQ<phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
            ((internal *)local_740,"m.get_allocator()","alloc",&local_750,&local_718);
  if (local_740[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_750);
    if (local_738 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_738->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_758,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=(&local_758,(Message *)&local_750);
    testing::internal::AssertHelper::~AssertHelper(&local_758);
    if ((long *)local_750.id_ != (long *)0x0) {
      (**(code **)(*(long *)local_750.id_ + 8))();
    }
  }
  if (local_738 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_738,local_738);
  }
  lVar2 = 0x38;
  lVar1 = 0;
  do {
    lVar1 = lVar1 + *(long *)((long)&local_710.sets_._M_elems[0].super_Lockable.super_mutex.
                                     super___mutex_base._M_mutex + lVar2);
    lVar2 = lVar2 + 0x70;
  } while (lVar2 != 0x738);
  local_750.id_._0_1_ = lVar1 == 0;
  local_748 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (lVar1 != 0) {
    testing::Message::Message((Message *)&local_758);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_740,(internal *)&local_750,(AssertionResult *)"m.empty()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_720,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x79,(char *)CONCAT71(local_740._1_7_,local_740[0]));
    testing::internal::AssertHelper::operator=(&local_720,(Message *)&local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_720);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_740._1_7_,local_740[0]) != &local_730) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_740._1_7_,local_740[0]),local_730._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_758.data_._4_4_,local_758.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_758.data_._4_4_,local_758.data_._0_4_) + 8))();
    }
  }
  if (local_748 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_748,local_748);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>::
  operator()(local_740,(char *)&local_750,
             (parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
              *)0x2e0a15);
  if (local_740[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_750);
    if (local_738 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_738->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_758,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x7a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_758,(Message *)&local_750);
    testing::internal::AssertHelper::~AssertHelper(&local_758);
    if ((long *)local_750.id_ != (long *)0x0) {
      (**(code **)(*(long *)local_750.id_ + 8))();
    }
  }
  if (local_738 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_738,local_738);
  }
  local_750.id_ =
       parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
       ::bucket_count(&local_710);
  local_758.data_._0_4_ = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)local_740,"m.bucket_count()","123",&local_750.id_,(int *)&local_758);
  if (local_740[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_750);
    if (local_738 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_738->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_758,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x7b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_758,(Message *)&local_750);
    testing::internal::AssertHelper::~AssertHelper(&local_758);
    if ((long *)local_750.id_ != (long *)0x0) {
      (**(code **)(*(long *)local_750.id_ + 8))();
    }
  }
  if (local_738 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_738,local_738);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~parallel_hash_set(&local_710);
  return;
}

Assistant:

void BucketCountAllocTest(std::true_type) {
  using A = typename TypeParam::allocator_type;
  A alloc(0);
  TypeParam m(123, alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_TRUE(m.empty());
  EXPECT_THAT(m, ::testing::UnorderedElementsAre());
  EXPECT_GE(m.bucket_count(), 123);
}